

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O3

char * google::protobuf::internal::TcParser::ParseOneMapEntry
                 (NodeBase *node,char *ptr,ParseContext *ctx,FieldAux *aux,TcParseTableBase *table,
                 FieldEntry *entry,UntypedMapBase *map)

{
  string *psVar1;
  char *pcVar2;
  char cVar3;
  byte bVar4;
  ushort uVar5;
  MapTypeCard MVar6;
  TypeInfo TVar7;
  LazyEagerVerifyFnType p_Var8;
  int32_t iVar9;
  bool bVar10;
  int iVar11;
  uint uVar12;
  ushort *puVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  pointer pcVar17;
  ulong uVar18;
  int iVar19;
  uint uVar20;
  int iVar21;
  uint res;
  ulong uVar22;
  uint uVar23;
  string *s;
  pointer pcVar24;
  pair<const_char_*,_int> pVar25;
  string_view sVar26;
  pair<const_char_*,_unsigned_int> pVar27;
  string_view message_name;
  string_view field_name;
  undefined1 in_stack_ffffffffffffff68;
  MapTypeCard local_8a;
  ushort *local_88;
  uint local_7c;
  NodeBase *local_78;
  ushort *local_68 [2];
  uint local_54;
  
  uVar5 = *(ushort *)aux;
  MVar6 = (aux->map_info).value_type_card;
  iVar9 = (aux->enum_range).last;
  local_88 = (ushort *)ptr;
  bVar10 = EpsCopyInputStream::DoneWithCheck<false>
                     (&ctx->super_EpsCopyInputStream,(char **)&local_88,ctx->group_depth_);
  if (!bVar10) {
    uVar12 = (uint)uVar5;
    uVar23 = uVar5 & 0xff;
    local_54 = (uint)(ushort)MVar6;
    uVar20 = local_54 & 0xff;
    psVar1 = (string *)(node + 1);
    local_7c = uVar12;
    local_78 = node;
    uVar16 = uVar23;
    do {
      bVar4 = (byte)*local_88;
      res = (uint)(char)bVar4;
      if (res == uVar20 || res == uVar23) {
        puVar13 = (ushort *)((long)local_88 + 1);
LAB_002c26f4:
        TVar7 = map->type_info_;
        if (res == uVar23) {
          uVar15 = (uint)TVar7 >> 0x18 & 0xffffff0f;
          local_8a = SUB42(uVar12,0);
          s = psVar1;
        }
        else {
          uVar15 = (uint)TVar7 >> 0x1c;
          s = (string *)((long)&node->next + (ulong)((uint)TVar7 >> 0x10 & 0xff));
          local_8a = SUB42(local_54,0);
        }
        uVar23 = uVar16;
        local_88 = puVar13;
        switch(res & 7) {
        case 0:
          pcVar24 = (pointer)(long)(char)(byte)*puVar13;
          if ((long)pcVar24 < 0) {
            uVar22 = 0xffffffffffffff80;
            res = 0xffffff80;
            uVar14 = (long)(char)*(byte *)((long)puVar13 + 1) << 7 | 0x7f;
            if ((long)uVar14 < 0) {
              uVar18 = (long)(char)(byte)puVar13[1] << 0xe | 0x3fff;
              if ((long)uVar18 < 0) {
                uVar22 = (long)(char)*(byte *)((long)puVar13 + 3) << 0x15 | 0x1fffff;
                uVar14 = uVar14 & uVar22;
                if ((long)uVar14 < 0) {
                  uVar22 = (long)(char)(byte)puVar13[2] << 0x1c | 0xfffffff;
                  uVar18 = uVar18 & uVar22;
                  if ((long)uVar18 < 0) {
                    uVar22 = (long)(char)*(byte *)((long)puVar13 + 5) << 0x23 | 0x7ffffffff;
                    uVar14 = uVar14 & uVar22;
                    if ((long)uVar14 < 0) {
                      uVar22 = (long)(char)(byte)puVar13[3] << 0x2a | 0x3ffffffffff;
                      uVar18 = uVar18 & uVar22;
                      if ((long)uVar18 < 0) {
                        uVar22 = (long)(char)*(byte *)((long)puVar13 + 7) << 0x31 | 0x1ffffffffffff;
                        uVar14 = uVar14 & uVar22;
                        if ((long)uVar14 < 0) {
                          uVar22 = (ulong)(byte)puVar13[4] << 0x38 | 0xffffffffffffff;
                          uVar18 = uVar18 & uVar22;
                          if ((long)uVar18 < 0) {
                            bVar4 = *(byte *)((long)puVar13 + 9);
                            uVar22 = CONCAT71((int7)(uVar22 >> 8),bVar4);
                            puVar13 = puVar13 + 5;
                            if (bVar4 != 1) {
                              if ((char)bVar4 < '\0') {
                                return (char *)0x0;
                              }
                              if ((bVar4 & 1) == 0) {
                                uVar18 = uVar18 ^ 0x8000000000000000;
                              }
                            }
                          }
                          else {
                            puVar13 = (ushort *)((long)puVar13 + 9);
                          }
                        }
                        else {
                          puVar13 = puVar13 + 4;
                        }
                      }
                      else {
                        puVar13 = (ushort *)((long)puVar13 + 7);
                      }
                    }
                    else {
                      puVar13 = puVar13 + 3;
                    }
                  }
                  else {
                    puVar13 = (ushort *)((long)puVar13 + 5);
                  }
                }
                else {
                  puVar13 = puVar13 + 2;
                }
              }
              else {
                puVar13 = (ushort *)((long)puVar13 + 3);
              }
              res = (uint)uVar22;
              uVar14 = uVar14 & uVar18;
            }
            else {
              puVar13 = puVar13 + 1;
            }
            pcVar24 = (pointer)((ulong)pcVar24 & uVar14);
          }
          else {
            puVar13 = (ushort *)((long)puVar13 + 1);
          }
          uVar12 = (uint)pcVar24;
          local_88 = puVar13;
          if ((char)uVar15 == '\x02') {
            bVar10 = MapTypeCard::is_zigzag(&local_8a);
            pcVar17 = (pointer)(-(ulong)(uVar12 & 1) ^ (ulong)pcVar24 >> 1);
            if (!bVar10) {
              pcVar17 = pcVar24;
            }
            (s->_M_dataplus)._M_p = pcVar17;
            node = local_78;
            uVar16 = uVar23;
          }
          else if (uVar15 == 1) {
            bVar10 = MapTypeCard::is_zigzag(&local_8a);
            uVar16 = -(uVar12 & 1) ^ (uint)((ulong)pcVar24 >> 1) & 0x7fffffff;
            if (!bVar10) {
              uVar16 = uVar12;
            }
            *(uint *)&(s->_M_dataplus)._M_p = uVar16;
            node = local_78;
            uVar16 = uVar23;
          }
          else {
            if (uVar15 != 0) goto LAB_002c2c8c;
            *(bool *)&(s->_M_dataplus)._M_p = pcVar24 != (pointer)0x0;
            node = local_78;
          }
          break;
        case 1:
          (s->_M_dataplus)._M_p = *(pointer *)puVar13;
          local_88 = puVar13 + 4;
          break;
        case 2:
          if ((char)uVar15 != '\x05') {
            if (uVar15 == 6) {
              if (res == uVar20) {
                if ((char)(byte)*puVar13 < '\0') {
                  pVar25 = ReadSizeFallback((char *)puVar13,(uint)(byte)*puVar13);
                  puVar13 = (ushort *)pVar25.first;
                  if (puVar13 == (ushort *)0x0) {
                    return (char *)0x0;
                  }
                }
                else {
                  puVar13 = (ushort *)((long)puVar13 + 1);
                }
                if (ctx->depth_ < 1) {
                  return (char *)0x0;
                }
                EpsCopyInputStream::PushLimit
                          ((EpsCopyInputStream *)local_68,(char *)ctx,(int)puVar13);
                iVar11 = (int)local_68[0];
                iVar19 = ctx->depth_ + -1;
                ctx->depth_ = iVar19;
                p_Var8 = aux[1].verify_func;
                local_68[0] = puVar13;
                while (bVar10 = EpsCopyInputStream::DoneWithCheck<false>
                                          (&ctx->super_EpsCopyInputStream,(char **)local_68,
                                           ctx->group_depth_), !bVar10) {
                  uVar12 = (uint)(byte)p_Var8[8] & (uint)*local_68[0];
                  if ((uVar12 & 7) != 0) goto LAB_002c2c6f;
                  uVar14 = (ulong)(uVar12 & 0xfffffff8);
                  local_68[0] = (ushort *)
                                (**(code **)(p_Var8 + uVar14 * 2 + 0x38))
                                          (s,local_68[0],ctx,
                                           (ulong)*local_68[0] ^
                                           *(ulong *)(p_Var8 + uVar14 * 2 + 0x40),p_Var8);
                  if ((local_68[0] == (ushort *)0x0) ||
                     ((ctx->super_EpsCopyInputStream).last_tag_minus_1_ != 0)) break;
                }
                if (((byte)p_Var8[9] & 1) == 0) {
                  if (local_68[0] == (ushort *)0x0) {
                    VerifyHasBitConsistency((MessageLite *)CONCAT44(uVar20,uVar16),table);
                    puVar13 = local_68[0];
                    goto LAB_002c2b90;
                  }
                  iVar21 = ctx->depth_;
                  puVar13 = local_68[0];
LAB_002c29fe:
                  if (iVar19 != iVar21) goto LAB_002c2c63;
                }
                else {
                  puVar13 = (ushort *)(**(code **)(p_Var8 + 0x28))(s,local_68[0],ctx);
LAB_002c2b90:
                  iVar21 = ctx->depth_;
                  if (puVar13 != (ushort *)0x0) goto LAB_002c29fe;
                  puVar13 = (ushort *)0x0;
                }
                ctx->depth_ = iVar21 + 1;
                uVar12 = iVar11 + (ctx->super_EpsCopyInputStream).limit_;
                (ctx->super_EpsCopyInputStream).limit_ = uVar12;
                if (((ctx->super_EpsCopyInputStream).last_tag_minus_1_ != 0) ||
                   ((ctx->super_EpsCopyInputStream).limit_end_ =
                         (ctx->super_EpsCopyInputStream).buffer_end_ +
                         (int)((int)uVar12 >> 0x1f & uVar12), node = local_78, uVar23 = uVar16,
                   local_88 = puVar13, puVar13 == (ushort *)0x0)) {
                  return (char *)0x0;
                }
                break;
              }
            }
            else {
              ParseOneMapEntry();
            }
            ParseOneMapEntry();
LAB_002c2c63:
            ParseOneMapEntry();
LAB_002c2c6f:
            protobuf_assumption_failed
                      ("(idx & 7) == 0",
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                       ,0x452);
          }
          bVar4 = (byte)*puVar13;
          uVar12 = (uint)bVar4;
          if ((char)bVar4 < '\0') {
            pVar25 = ReadSizeFallback((char *)puVar13,(uint)bVar4);
            uVar12 = pVar25.second;
            local_88 = (ushort *)pVar25.first;
            if (local_88 == (ushort *)0x0) {
              return (char *)0x0;
            }
          }
          else {
            local_88 = (ushort *)((long)puVar13 + 1);
          }
          local_88 = (ushort *)
                     EpsCopyInputStream::ReadString
                               (&ctx->super_EpsCopyInputStream,(char *)local_88,uVar12,s);
          if (local_88 == (ushort *)0x0) {
            return (char *)0x0;
          }
          bVar10 = MapTypeCard::is_utf8(&local_8a);
          node = local_78;
          uVar23 = uVar16;
          if ((bVar10 && (iVar9 & 0xc) != 0) &&
             (iVar11 = utf8_range_IsValid((s->_M_dataplus)._M_p,s->_M_string_length),
             node = local_78, uVar23 = uVar16, iVar11 == 0)) {
            pcVar2 = (char *)((long)&table->has_bits_offset +
                             (ulong)table->num_aux_entries * 8 + (ulong)table->aux_offset);
            uVar5 = table->num_field_entries;
            cVar3 = *pcVar2;
            sVar26 = FieldName(table,entry);
            message_name._M_str = (char *)sVar26._M_len;
            message_name._M_len = (size_t)(pcVar2 + (uVar5 + 8 & 0xfffffff8));
            field_name._M_str = "parsing";
            field_name._M_len = (size_t)sVar26._M_str;
            PrintUTF8ErrorLog((internal *)(long)cVar3,message_name,field_name,(char *)0x0,
                              (bool)in_stack_ffffffffffffff68);
            node = local_78;
            uVar23 = uVar16;
            if ((iVar9 & 4) != 0) {
              return (char *)0x0;
            }
          }
          break;
        default:
          ParseOneMapEntry();
LAB_002c2c8c:
          ParseOneMapEntry();
LAB_002c2c91:
          (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = res - 1;
          return (char *)puVar13;
        case 5:
          *(undefined4 *)&(s->_M_dataplus)._M_p = *(undefined4 *)puVar13;
          local_88 = puVar13 + 2;
        }
      }
      else {
        res = (uint)bVar4;
        puVar13 = (ushort *)((long)local_88 + 1);
        if ((char)bVar4 < '\0') {
          res = ((uint)bVar4 + (uint)*(byte *)puVar13 * 0x80) - 0x80;
          if ((char)*(byte *)puVar13 < '\0') {
            pVar27 = ReadTagFallback((char *)local_88,res);
            puVar13 = (ushort *)pVar27.first;
            res = pVar27.second;
          }
          else {
            puVar13 = local_88 + 1;
          }
        }
        if (res == uVar20 || res == uVar23) goto LAB_002c26f4;
        if (puVar13 == (ushort *)0x0) {
          return (char *)0x0;
        }
        if ((res == 0) || ((res & 7) == 4)) goto LAB_002c2c91;
        local_88 = puVar13;
        local_88 = (ushort *)UnknownFieldParse(res,(string *)0x0,(char *)puVar13,ctx);
        node = local_78;
        if (local_88 == (ushort *)0x0) {
          return (char *)0x0;
        }
      }
      uVar12 = local_7c;
      bVar10 = EpsCopyInputStream::DoneWithCheck<false>
                         (&ctx->super_EpsCopyInputStream,(char **)&local_88,ctx->group_depth_);
    } while (!bVar10);
  }
  return (char *)local_88;
}

Assistant:

const char* TcParser::ParseOneMapEntry(
    NodeBase* node, const char* ptr, ParseContext* ctx,
    const TcParseTableBase::FieldAux* aux, const TcParseTableBase* table,
    const TcParseTableBase::FieldEntry& entry, UntypedMapBase& map) {
  using WFL = WireFormatLite;

  const auto map_info = aux[0].map_info;
  const uint8_t key_tag = map_info.key_type_card.tag();
  const uint8_t value_tag = map_info.value_type_card.tag();

  while (!ctx->Done(&ptr)) {
    uint32_t inner_tag = ptr[0];

    if (ABSL_PREDICT_FALSE(inner_tag != key_tag && inner_tag != value_tag)) {
      // Do a full parse and check again in case the tag has non-canonical
      // encoding.
      ptr = ReadTag(ptr, &inner_tag);
      if (ABSL_PREDICT_FALSE(inner_tag != key_tag && inner_tag != value_tag)) {
        if (ABSL_PREDICT_FALSE(ptr == nullptr)) return nullptr;

        if (inner_tag == 0 || (inner_tag & 7) == WFL::WIRETYPE_END_GROUP) {
          ctx->SetLastTag(inner_tag);
          break;
        }

        ptr = UnknownFieldParse(inner_tag, nullptr, ptr, ctx);
        if (ABSL_PREDICT_FALSE(ptr == nullptr)) return nullptr;
        continue;
      }
    } else {
      ++ptr;
    }

    MapTypeCard type_card;
    UntypedMapBase::TypeKind type_kind;
    void* obj;
    if (inner_tag == key_tag) {
      type_card = map_info.key_type_card;
      type_kind = map.type_info().key_type_kind();
      obj = node->GetVoidKey();
    } else {
      type_card = map_info.value_type_card;
      type_kind = map.type_info().value_type_kind();
      obj = map.GetVoidValue(node);
    }

    switch (inner_tag & 7) {
      case WFL::WIRETYPE_VARINT:
        uint64_t tmp;
        ptr = ParseVarint(ptr, &tmp);
        if (ABSL_PREDICT_FALSE(ptr == nullptr)) return nullptr;
        switch (type_kind) {
          case UntypedMapBase::TypeKind::kBool:
            *reinterpret_cast<bool*>(obj) = static_cast<bool>(tmp);
            continue;
          case UntypedMapBase::TypeKind::kU32: {
            uint32_t v = static_cast<uint32_t>(tmp);
            if (type_card.is_zigzag()) v = WFL::ZigZagDecode32(v);
            memcpy(obj, &v, sizeof(v));
            continue;
          }
          case UntypedMapBase::TypeKind::kU64:
            if (type_card.is_zigzag()) tmp = WFL::ZigZagDecode64(tmp);
            memcpy(obj, &tmp, sizeof(tmp));
            continue;
          default:
            Unreachable();
        }
      case WFL::WIRETYPE_FIXED32:
        ptr = ReadFixed<uint32_t>(obj, ptr);
        continue;
      case WFL::WIRETYPE_FIXED64:
        ptr = ReadFixed<uint64_t>(obj, ptr);
        continue;
      case WFL::WIRETYPE_LENGTH_DELIMITED:
        if (type_kind == UntypedMapBase::TypeKind::kString) {
          const int size = ReadSize(&ptr);
          if (ABSL_PREDICT_FALSE(ptr == nullptr)) return nullptr;
          std::string* str = reinterpret_cast<std::string*>(obj);
          ptr = ctx->ReadString(ptr, size, str);
          if (ABSL_PREDICT_FALSE(ptr == nullptr)) return nullptr;
          bool do_utf8_check = map_info.fail_on_utf8_failure;
#ifndef NDEBUG
          do_utf8_check |= map_info.log_debug_utf8_failure;
#endif
          if (type_card.is_utf8() && do_utf8_check &&
              !utf8_range::IsStructurallyValid(*str)) {
            PrintUTF8ErrorLog(MessageName(table), FieldName(table, &entry),
                              "parsing", false);
            if (map_info.fail_on_utf8_failure) {
              return nullptr;
            }
          }
          continue;
        } else {
          ABSL_DCHECK_EQ(static_cast<int>(type_kind),
                         static_cast<int>(UntypedMapBase::TypeKind::kMessage));
          ABSL_DCHECK_EQ(inner_tag, value_tag);
          ptr = ctx->ParseLengthDelimitedInlined(ptr, [&](const char* ptr) {
            return ParseLoop(reinterpret_cast<MessageLite*>(obj), ptr, ctx,
                             aux[1].table);
          });
          if (ABSL_PREDICT_FALSE(ptr == nullptr)) return nullptr;
          continue;
        }
      default:
        Unreachable();
    }
  }
  return ptr;
}